

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_read_one(sexp ctx,sexp in,sexp_conflict *shares)

{
  sexp res;
  sexp in_stack_00000058;
  sexp in_stack_00000060;
  char *in_stack_00000068;
  sexp in_stack_00000070;
  sexp_conflict *in_stack_000001b0;
  sexp in_stack_000001b8;
  sexp in_stack_000001c0;
  undefined8 local_20;
  
  local_20 = sexp_read_raw(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  if (local_20 == (sexp)0x63e) {
    local_20 = sexp_read_error(in_stack_00000070,in_stack_00000068,in_stack_00000060,
                               in_stack_00000058);
  }
  else if (local_20 == (sexp)0xc3e) {
    local_20 = sexp_read_error(in_stack_00000070,in_stack_00000068,in_stack_00000060,
                               in_stack_00000058);
  }
  else if (local_20 == (sexp)0x73e) {
    local_20 = sexp_read_error(in_stack_00000070,in_stack_00000068,in_stack_00000060,
                               in_stack_00000058);
  }
  return local_20;
}

Assistant:

sexp sexp_read_one (sexp ctx, sexp in, sexp *shares) {
  sexp res = sexp_read_raw(ctx, in, shares);
  if (res == SEXP_CLOSE)
    res = sexp_read_error(ctx, "too many ')'s", SEXP_NULL, in);
#if SEXP_USE_OBJECT_BRACE_LITERALS
  else if (res == SEXP_CLOSE_BRACE)
    res = sexp_read_error(ctx, "too many '}'s", SEXP_NULL, in);
#endif
  else if (res == SEXP_RAWDOT)
    res = sexp_read_error(ctx, "unexpected '.'", SEXP_NULL, in);
  return res;
}